

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

void gen_rim_i64(TCGContext_conflict12 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b,int64_t c)

{
  TCGv_i64 ret;
  TCGv_i64 t;
  int64_t c_local;
  TCGv_i64 b_local;
  TCGv_i64 a_local;
  TCGv_i64 d_local;
  TCGContext_conflict12 *tcg_ctx_local;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_rotli_i64_s390x(tcg_ctx,ret,a,(uint)c & 0x3f);
  tcg_gen_and_i64_s390x(tcg_ctx,ret,ret,b);
  tcg_gen_andc_i64_s390x(tcg_ctx,d,d,b);
  tcg_gen_or_i64_s390x(tcg_ctx,d,d,ret);
  tcg_temp_free_i64(tcg_ctx,ret);
  return;
}

Assistant:

static void gen_rim_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b, int64_t c)
{
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_rotli_i64(tcg_ctx, t, a, c & 63);
    tcg_gen_and_i64(tcg_ctx, t, t, b);
    tcg_gen_andc_i64(tcg_ctx, d, d, b);
    tcg_gen_or_i64(tcg_ctx, d, d, t);

    tcg_temp_free_i64(tcg_ctx, t);
}